

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiff
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  int iVar1;
  iterator __position;
  _List_const_iterator<GF2::MM<6UL>_> __first;
  
  if (this == polyRight) {
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
              (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
    return;
  }
  __position._M_node =
       (this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  __first._M_node = (_List_node_base *)polyRight;
  do {
    __first._M_node = (__first._M_node)->_M_next;
    while( true ) {
      if ((__position._M_node == (_List_node_base *)this) ||
         (__first._M_node == (_List_node_base *)polyRight)) {
        if (__position._M_node != (_List_node_base *)this) {
          return;
        }
        std::__cxx11::list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>>::
        insert<std::_List_const_iterator<GF2::MM<6ul>>,void>
                  ((list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)this,(const_iterator)this,
                   __first,(_List_const_iterator<GF2::MM<6UL>_>)polyRight);
        return;
      }
      iVar1 = MOGrevlex<6UL>::Compare
                        ((MOGrevlex<6UL> *)&this->field_0x18,(MM<6UL> *)(__position._M_node + 1),
                         (MM<6UL> *)(__first._M_node + 1));
      if (iVar1 < 1) break;
      __position._M_node = (__position._M_node)->_M_next;
    }
    if (iVar1 < 0) {
      __position = std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::insert
                             (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,
                              __position._M_node,__first._M_node + 1);
    }
    else {
      __position = std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::erase
                             (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,
                              __position._M_node);
    }
  } while( true );
}

Assistant:

void SymDiff(const MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin();
		const_iterator iterRight = polyRight.begin();
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// вставить новый моном
				if (cmp < 0) iter = insert(iter, *iterRight);
				// исключить повтор
				else iter = erase(iter);
				// к следующему 
				++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			insert(end(), iterRight, polyRight.end());
	}